

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.h
# Opt level: O1

JointBeliefSparse * __thiscall JointBeliefSparse::Clone(JointBeliefSparse *this)

{
  long lVar1;
  size_type sVar2;
  undefined8 uVar3;
  JointBeliefSparse *pJVar4;
  unsigned_long *__dest;
  double *__dest_00;
  
  pJVar4 = (JointBeliefSparse *)operator_new(0x58);
  *(undefined ***)pJVar4 = &PTR__JointBeliefInterface_005cccd0;
  lVar1 = *(long *)(*(long *)this + -0xd8);
  *(undefined ***)&pJVar4->field_0x8 = &PTR__BeliefSparse_005cce48;
  *(undefined ***)pJVar4 = &PTR__BeliefSparse_005ccfa8;
  uVar3 = *(undefined8 *)((long)(&this->field_0x8 + lVar1) + 8);
  *(undefined8 *)&pJVar4->field_0x10 = *(undefined8 *)(&this->field_0x8 + lVar1);
  *(undefined8 *)&pJVar4->field_0x18 = uVar3;
  *(undefined8 *)&pJVar4->field_0x20 = *(undefined8 *)(&this->field_0x18 + lVar1);
  sVar2 = *(size_type *)(&this->field_0x28 + lVar1);
  *(size_type *)&pJVar4->field_0x30 = sVar2;
  if (sVar2 == 0) {
    *(undefined8 *)&pJVar4->field_0x38 = 0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)&pJVar4->field_0x28,sVar2,(void *)0x0);
    *(unsigned_long **)&pJVar4->field_0x38 = __dest;
    if (*(long *)(&this->field_0x28 + lVar1) != 0) {
      memmove(__dest,*(void **)(&this->field_0x30 + lVar1),*(long *)(&this->field_0x28 + lVar1) << 3
             );
    }
  }
  sVar2 = *(size_type *)(&this->field_0x40 + lVar1);
  *(size_type *)&pJVar4->field_0x48 = sVar2;
  if (sVar2 == 0) {
    *(undefined8 *)&pJVar4->field_0x50 = 0;
  }
  else {
    __dest_00 = __gnu_cxx::new_allocator<double>::allocate
                          ((new_allocator<double> *)&pJVar4->field_0x40,sVar2,(void *)0x0);
    *(double **)&pJVar4->field_0x50 = __dest_00;
    if (*(long *)(&this->field_0x40 + lVar1) != 0) {
      memmove(__dest_00,*(void **)(&this->field_0x48 + lVar1),
              *(long *)(&this->field_0x40 + lVar1) << 3);
    }
  }
  *(undefined8 *)pJVar4 = 0x5cc960;
  *(undefined8 *)&pJVar4->field_0x8 = 0x5ccae0;
  return pJVar4;
}

Assistant:

virtual JointBeliefSparse* Clone() const
        { return new JointBeliefSparse(*this); }